

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

model_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_downwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          model_node_type *parent,int bucketID,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,bool reuse_model)

{
  int *piVar1;
  longlong *plVar2;
  undefined4 uVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  short sVar7;
  data_node_type *old_node;
  undefined1 auVar8 [16];
  model_node_type *parent_00;
  AlexNode<int,_int> **ppAVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  undefined7 in_register_00000089;
  int iVar13;
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  new_allocator<alex::AlexNode<int,_int>_*> local_45;
  int local_44;
  undefined4 local_40;
  int local_3c;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000089,reuse_model);
  old_node = (data_node_type *)parent->children_[bucketID];
  piVar1 = &(this->stats_).num_downward_splits;
  *piVar1 = *piVar1 + 1;
  plVar2 = &(this->stats_).num_downward_split_keys;
  *plVar2 = *plVar2 + (long)old_node->num_keys_;
  iVar12 = 1 << (fanout_tree_depth & 0x1fU);
  local_44 = fanout_tree_depth;
  local_38 = used_fanout_tree_nodes;
  parent_00 = (model_node_type *)operator_new(0x40);
  sVar7 = (old_node->super_AlexNode<int,_int>).level_;
  (parent_00->super_AlexNode<int,_int>).is_leaf_ = false;
  (parent_00->super_AlexNode<int,_int>).level_ = sVar7;
  (parent_00->super_AlexNode<int,_int>).model_.a_ = 0.0;
  (parent_00->super_AlexNode<int,_int>).model_.b_ = 0.0;
  (parent_00->super_AlexNode<int,_int>).cost_ = 0.0;
  (parent_00->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00156b98;
  parent_00->allocator_ = (allocator<std::pair<int,_int>_> *)&this->field_0xbd;
  parent_00->children_ = (AlexNode<int,_int> **)0x0;
  (parent_00->super_AlexNode<int,_int>).duplication_factor_ =
       (old_node->super_AlexNode<int,_int>).duplication_factor_;
  parent_00->num_children_ = iVar12;
  ppAVar9 = __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                      (&local_45,(long)iVar12,(void *)0x0);
  parent_00->children_ = ppAVar9;
  iVar11 = 1 << ((old_node->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  dVar15 = 0.0;
  dVar4 = (parent->super_AlexNode<int,_int>).model_.a_;
  dVar5 = (parent->super_AlexNode<int,_int>).model_.b_;
  iVar13 = bucketID - bucketID % iVar11;
  local_3c = iVar13 + iVar11;
  dVar18 = (double)iVar13 - dVar5;
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    dVar18 = dVar18 / dVar4;
    dVar15 = (1.0 / (((double)local_3c - dVar5) / dVar4 - dVar18)) * (double)iVar12;
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar15;
    auVar14 = vxorpd_avx512vl(auVar16,auVar14);
    dVar18 = dVar18 * auVar14._0_8_;
  }
  else {
    auVar8._8_8_ = 0x8000000000000000;
    auVar8._0_8_ = 0x8000000000000000;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar18;
    auVar14 = vxorpd_avx512vl(auVar19,auVar8);
    dVar18 = auVar14._0_8_ / (double)iVar11;
  }
  (parent_00->super_AlexNode<int,_int>).model_.a_ = dVar15;
  (parent_00->super_AlexNode<int,_int>).model_.b_ = dVar18;
  if ((local_38->
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (local_38->
      super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    if (local_44 != 1) {
      __assert_fail("fanout_tree_depth == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                    ,0x650,
                    "model_node_type *alex::Alex<int, int>::split_downwards(model_node_type *, int, int, std::vector<fanout_tree::FTNode> &, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    create_two_new_data_nodes(this,old_node,parent_00,1,local_40._0_1_,0);
  }
  else {
    create_new_data_nodes(this,old_node,parent_00,local_44,local_38,0,0);
  }
  delete_node(this,(AlexNode<int,_int> *)old_node);
  uVar3 = (this->stats_).num_model_nodes;
  uVar6 = (this->stats_).num_data_nodes;
  auVar17._4_4_ = uVar6;
  auVar17._0_4_ = uVar3;
  lVar10 = (long)iVar13;
  auVar17._8_8_ = 0;
  auVar14 = vpaddd_avx(auVar17,_DAT_0013c340);
  (this->stats_).num_model_nodes = (int)auVar14._0_8_;
  (this->stats_).num_data_nodes = (int)((ulong)auVar14._0_8_ >> 0x20);
  for (; lVar10 < local_3c; lVar10 = lVar10 + 1) {
    parent->children_[lVar10] = (AlexNode<int,_int> *)parent_00;
  }
  if (this->superroot_ == parent) {
    this->root_node_ = (AlexNode<int,_int> *)parent_00;
    update_superroot_pointer(this);
  }
  return parent_00;
}

Assistant:

model_node_type* split_downwards(
      model_node_type* parent, int bucketID, int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      bool reuse_model) {
    auto leaf = static_cast<data_node_type*>(parent->children_[bucketID]);
    stats_.num_downward_splits++;
    stats_.num_downward_split_keys += leaf->num_keys_;

    // Create the new model node that will replace the current data node
    int fanout = 1 << fanout_tree_depth;
    auto new_node = new (model_node_allocator().allocate(1))
        model_node_type(leaf->level_, allocator_);
    new_node->duplication_factor_ = leaf->duplication_factor_;
    new_node->num_children_ = fanout;
    new_node->children_ =
        new (pointer_allocator().allocate(fanout)) AlexNode<T, P>*[fanout];

    int repeats = 1 << leaf->duplication_factor_;
    int start_bucketID =
        bucketID - (bucketID % repeats);  // first bucket with same child
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with different child
    if (parent->model_.a_ == 0){
      new_node->model_.a_ = 0;
      new_node->model_.b_ = -1.0 * (start_bucketID - parent->model_.b_) / repeats;
    }
    else{
      double left_boundary_value =
          (start_bucketID - parent->model_.b_) / parent->model_.a_;
      double right_boundary_value =
          (end_bucketID - parent->model_.b_) / parent->model_.a_;
      new_node->model_.a_ =
          1.0 / (right_boundary_value - left_boundary_value) * fanout;
      new_node->model_.b_ = -new_node->model_.a_ * left_boundary_value;
    }

    // Create new data nodes
    if (used_fanout_tree_nodes.empty()) {
      assert(fanout_tree_depth == 1);
      create_two_new_data_nodes(leaf, new_node, fanout_tree_depth, reuse_model);
    } else {
      create_new_data_nodes(leaf, new_node, fanout_tree_depth,
                            used_fanout_tree_nodes);
    }

    delete_node(leaf);
    stats_.num_data_nodes--;
    stats_.num_model_nodes++;
    for (int i = start_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = new_node;
    }
    if (parent == superroot_) {
      root_node_ = new_node;
      update_superroot_pointer();
    }

    return new_node;
  }